

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O2

BOOL __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::IsIdContinueNext
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr startingLocation,
          EncodedCharPtr endOfSource)

{
  bool bVar1;
  uint uVar2;
  EncodedCharPtr local_20;
  EncodedCharPtr startingLocation_local;
  codepoint_t nextCodepoint;
  bool ignore;
  
  local_20 = startingLocation;
  bVar1 = TryReadCodePoint<false>
                    (this,&local_20,endOfSource,(codepoint_t *)&startingLocation_local,
                     (bool *)((long)&startingLocation_local + 7),
                     (bool *)((long)&startingLocation_local + 7));
  uVar2 = 0;
  if (bVar1) {
    bVar1 = Js::CharClassifier::IsIdContinue
                      (this->charClassifier,(codepoint_t)startingLocation_local);
    uVar2 = (uint)bVar1;
  }
  return uVar2;
}

Assistant:

inline BOOL IsIdContinueNext(EncodedCharPtr startingLocation, EncodedCharPtr endOfSource)
    {
        codepoint_t nextCodepoint;
        bool ignore;

        if (TryReadCodePoint<false>(startingLocation, endOfSource, &nextCodepoint, &ignore, &ignore))
        {
            return charClassifier->IsIdContinue(nextCodepoint);
        }

        return false;
    }